

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void CP_ReleaseTimestepHandler
               (CManager cm,CMConnection conn,void *Msg_v,void *client_data,attr_list attrs)

{
  WS_ReaderInfo p_Var1;
  SstStream s;
  _ReleaseRec *p_Var2;
  SstStream in_RCX;
  long *in_RDX;
  WS_ReaderInfo in_R8;
  int i;
  int ReaderNum;
  SstStream ParentStream;
  WS_ReaderInfo Reader;
  _ReleaseTimestepMsg *Msg;
  char *tmpstr;
  uint local_50;
  uint local_4c;
  SstStream in_stack_ffffffffffffffd0;
  
  if (_perfstubs_initialized == 1) {
    if (CP_ReleaseTimestepHandler::timer == (void *)0x0) {
      in_stack_ffffffffffffffd0 =
           (SstStream)
           ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/sst/cp/cp_writer.c"
                               ,"CP_ReleaseTimestepHandler",0xa3c);
      CP_ReleaseTimestepHandler::timer = (void *)ps_timer_create_(in_stack_ffffffffffffffd0);
      free(in_stack_ffffffffffffffd0);
    }
    ps_timer_start_(CP_ReleaseTimestepHandler::timer);
  }
  p_Var1 = (WS_ReaderInfo)*in_RDX;
  s = p_Var1->ParentStream;
  local_4c = 0xffffffff;
  pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
  if (s->Status == Destroyed) {
    CP_verbose(s,PerRankVerbose,
               "Writer-side Rank received a timestep release event on destroyed stream %p, ignored\n"
               ,s);
    pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
  }
  else {
    for (local_50 = 0; (int)local_50 < s->ReaderCount; local_50 = local_50 + 1) {
      if (p_Var1 == s->Readers[(int)local_50]) {
        local_4c = local_50;
      }
    }
    CP_verbose(s,TraceVerbose,
               "Received a release timestep message for timestep %ld from reader cohort %d\n",
               in_RDX[1],(ulong)local_4c);
    CP_verbose(s,TraceVerbose,"Got the lock in release timestep\n");
    p_Var1->LastReleasedTimestep = in_RDX[1];
    if ((s->Rank == 0) && (s->ConfigParams->CPCommPattern == 0)) {
      p_Var2 = (_ReleaseRec *)realloc(s->ReleaseList,(long)(s->ReleaseCount + 1) << 4);
      s->ReleaseList = p_Var2;
      s->ReleaseList[s->ReleaseCount].Timestep = in_RDX[1];
      s->ReleaseList[s->ReleaseCount].Reader = p_Var1;
      s->ReleaseCount = s->ReleaseCount + 1;
    }
    CP_verbose(s,TraceVerbose,"Doing dereference sent\n");
    DerefSentTimestep(in_RCX,in_R8,(ssize_t)in_stack_ffffffffffffffd0);
    CP_verbose(s,TraceVerbose,"Doing QueueMaint\n");
    QueueMaintenance(in_stack_ffffffffffffffd0);
    p_Var1->OldestUnreleasedTimestep = in_RDX[1] + 1;
    pthread_cond_signal((pthread_cond_t *)&s->DataCondition);
    CP_verbose(s,TraceVerbose,"Releasing the lock in release timestep\n");
    pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
    if (_perfstubs_initialized == 1) {
      ps_timer_stop_(CP_ReleaseTimestepHandler::timer);
    }
  }
  return;
}

Assistant:

extern void CP_ReleaseTimestepHandler(CManager cm, CMConnection conn, void *Msg_v,
                                      void *client_data, attr_list attrs)
{
    PERFSTUBS_TIMER_START_FUNC(timer);
    struct _ReleaseTimestepMsg *Msg = (struct _ReleaseTimestepMsg *)Msg_v;
    WS_ReaderInfo Reader = (WS_ReaderInfo)Msg->WSR_Stream;
    SstStream ParentStream = Reader->ParentStream;
    int ReaderNum = -1;

    STREAM_MUTEX_LOCK(ParentStream);
    if (ParentStream->Status == Destroyed)
    {
        CP_verbose(ParentStream, PerRankVerbose,
                   "Writer-side Rank received a "
                   "timestep release event on destroyed stream %p, ignored\n",
                   ParentStream);
        STREAM_MUTEX_UNLOCK(ParentStream);
        return;
    }
    for (int i = 0; i < ParentStream->ReaderCount; i++)
    {
        if (Reader == ParentStream->Readers[i])
        {
            ReaderNum = i;
        }
    }
    CP_verbose(ParentStream, TraceVerbose,
               "Received a release timestep message "
               "for timestep %ld from reader cohort %d\n",
               Msg->Timestep, ReaderNum);

    /* decrement the reference count for the released timestep */
    CP_verbose(ParentStream, TraceVerbose, "Got the lock in release timestep\n");
    Reader->LastReleasedTimestep = Msg->Timestep;
    if ((ParentStream->Rank == 0) && (ParentStream->ConfigParams->CPCommPattern == SstCPCommMin))
    {
        ParentStream->ReleaseList =
            realloc(ParentStream->ReleaseList,
                    sizeof(ParentStream->ReleaseList[0]) * (ParentStream->ReleaseCount + 1));
        ParentStream->ReleaseList[ParentStream->ReleaseCount].Timestep = Msg->Timestep;
        ParentStream->ReleaseList[ParentStream->ReleaseCount].Reader = Reader;
        ParentStream->ReleaseCount++;
    }
    CP_verbose(ParentStream, TraceVerbose, "Doing dereference sent\n");
    DerefSentTimestep(ParentStream, Reader, Msg->Timestep);
    CP_verbose(ParentStream, TraceVerbose, "Doing QueueMaint\n");
    QueueMaintenance(ParentStream);
    Reader->OldestUnreleasedTimestep = Msg->Timestep + 1;
    STREAM_CONDITION_SIGNAL(ParentStream);
    CP_verbose(ParentStream, TraceVerbose, "Releasing the lock in release timestep\n");
    STREAM_MUTEX_UNLOCK(ParentStream);
    PERFSTUBS_TIMER_STOP_FUNC(timer);
}